

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenUtils.hpp
# Opt level: O0

Index pgi::detail::sample_from_pmf<Eigen::SparseVector<double,0,int>>
                (SparseMatrixBase<Eigen::SparseVector<double,_0,_int>_> *pmf,Scalar *random01)

{
  Index IVar1;
  runtime_error *this;
  double *in_RSI;
  SparseMatrixBase<Eigen::SparseVector<double,_0,_int>_> *in_RDI;
  Scalar SVar2;
  Index i;
  SparseVector<double,_0,_int> *mat;
  Scalar cumulative;
  Index in_stack_ffffffffffffffb8;
  SparseVector<double,_0,_int> *this_00;
  SparseVector<double,_0,_int> *local_28;
  double local_18;
  
  local_18 = 0.0;
  Eigen::SparseMatrixBase<Eigen::SparseVector<double,_0,_int>_>::derived(in_RDI);
  local_28 = (SparseVector<double,_0,_int> *)0x0;
  while( true ) {
    this_00 = local_28;
    IVar1 = Eigen::SparseMatrixBase<Eigen::SparseVector<double,_0,_int>_>::size
                      ((SparseMatrixBase<Eigen::SparseVector<double,_0,_int>_> *)local_28);
    if (IVar1 <= (long)this_00) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"failed sampling!");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    SVar2 = Eigen::SparseVector<double,_0,_int>::coeff(this_00,in_stack_ffffffffffffffb8);
    local_18 = SVar2 + local_18;
    if (*in_RSI <= local_18) break;
    local_28 = (SparseVector<double,_0,_int> *)&local_28->field_0x1;
  }
  return (Index)local_28;
}

Assistant:

typename Eigen::SparseMatrixBase<Derived>::Index sample_from_pmf(
    const Eigen::SparseMatrixBase<Derived>& pmf,
    const typename Derived::Scalar& random01) {
  typename Derived::Scalar cumulative(0);
  const Derived& mat(pmf.derived());
  for (typename Eigen::SparseMatrixBase<Derived>::Index i = 0; i < pmf.size();
       ++i) {
    cumulative += mat.coeff(i);
    if (cumulative >= random01) return i;
  }
  throw std::runtime_error("failed sampling!");
}